

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * fmt::v9::detail::
       parse_precision<char,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v9::detail::specs_handler<char>_> *handler)

{
  int iVar1;
  char *begin_00;
  char *local_58;
  precision_adapter local_50;
  undefined1 local_48 [40];
  
  local_58 = begin + 1;
  if (local_58 != end) {
    if ((int)*local_58 - 0x30U < 10) {
      iVar1 = parse_nonnegative_int<char>(&local_58,end,-1);
      if (iVar1 == -1) {
        throw_format_error("number is too big");
      }
      ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->precision = iVar1;
    }
    else {
      if (*local_58 != '{') goto LAB_00228f0f;
      begin_00 = begin + 2;
      if (begin_00 != end) {
        local_50.handler = handler;
        if ((*begin_00 == ':') || (*begin_00 == '}')) {
          specs_handler<char>::get_arg(local_48,&handler->super_specs_handler<char>);
          iVar1 = get_dynamic_spec<fmt::v9::detail::precision_checker,fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,fmt::v9::detail::error_handler>
                            ();
          ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->precision = iVar1;
        }
        else {
          begin_00 = do_parse_arg_id<char,fmt::v9::detail::parse_precision<char,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&)::precision_adapter&>
                               (begin_00,end,&local_50);
        }
      }
      if ((begin_00 == end) || (local_58 = begin_00 + 1, *begin_00 != '}')) {
        throw_format_error("invalid format string");
      }
    }
    if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
      throw_format_error("precision not allowed for this argument type");
    }
    return local_58;
  }
LAB_00228f0f:
  throw_format_error("missing precision specifier");
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}